

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::fill_n<fmt::v11::basic_appender<char>,unsigned_long,char>
          (basic_appender<char> out,unsigned_long count,char *value)

{
  basic_appender<char> this;
  char *in_RDX;
  ulong in_RSI;
  buffer<char> *in_RDI;
  unsigned_long i;
  char c;
  ulong local_28;
  basic_appender<char> local_10 [2];
  
  local_10[0].container = in_RDI;
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    c = *in_RDX;
    this = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*((basic_appender<char> *)&stack0xffffffffffffffd0);
    basic_appender<char>::operator=((basic_appender<char> *)this.container,c);
  }
  return (basic_appender<char>)local_10[0].container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}